

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O3

void __thiscall basisu::priority_queue::down_heap(priority_queue *this,uint32_t heap_index)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint32_t uVar4;
  entry *peVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar6 = (this->m_heap).m_size;
  if (heap_index < uVar6) {
    uVar8 = (ulong)heap_index;
    peVar5 = (this->m_heap).m_p;
    uVar4 = peVar5[uVar8].m_index;
    fVar2 = peVar5[uVar8].m_priority;
    uVar11 = heap_index * 2;
    uVar7 = this->m_size;
    uVar10 = (ulong)heap_index;
    if (uVar11 <= uVar7) {
      do {
        uVar8 = uVar10;
        heap_index = (uint32_t)uVar8;
        uVar6 = (this->m_heap).m_size;
        if (uVar11 < uVar7) {
          if ((uVar6 <= uVar11) || (uVar7 = uVar11 | 1, uVar6 <= uVar7)) goto LAB_0023bc90;
          peVar5 = (this->m_heap).m_p;
          fVar3 = peVar5[uVar7].m_priority;
          pfVar1 = &peVar5[uVar11].m_priority;
          uVar10 = (ulong)uVar11;
          if (*pfVar1 <= fVar3 && fVar3 != *pfVar1) {
            uVar10 = (ulong)uVar7;
          }
        }
        else {
          uVar10 = (ulong)uVar11;
        }
        uVar9 = (uint)uVar10;
        if (uVar6 <= uVar9) goto LAB_0023bc90;
        peVar5 = (this->m_heap).m_p;
        if (peVar5[uVar10].m_priority <= fVar2 && fVar2 != peVar5[uVar10].m_priority)
        goto LAB_0023bc74;
        if (uVar6 <= heap_index) goto LAB_0023bc90;
        peVar5[uVar8] = peVar5[uVar10];
        uVar11 = uVar9 * 2;
        uVar7 = this->m_size;
      } while (uVar11 <= uVar7);
      uVar6 = (this->m_heap).m_size;
      uVar8 = uVar10;
      heap_index = uVar9;
    }
LAB_0023bc74:
    if ((heap_index < uVar6) &&
       ((this->m_heap).m_p[uVar8].m_index = uVar4, heap_index < (this->m_heap).m_size)) {
      (this->m_heap).m_p[uVar8].m_priority = fVar2;
      return;
    }
  }
LAB_0023bc90:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,
                "T &basisu::vector<basisu::priority_queue::entry>::operator[](size_t) [T = basisu::priority_queue::entry]"
               );
}

Assistant:

inline void down_heap(uint32_t heap_index)
		{
			uint32_t orig_index = m_heap[heap_index].m_index;
			const float orig_priority = m_heap[heap_index].m_priority;

			uint32_t child_index;
			while ((child_index = (heap_index << 1)) <= m_size)
			{
				if ((child_index < m_size) && (m_heap[child_index].m_priority < m_heap[child_index + 1].m_priority)) ++child_index;
				if (orig_priority > m_heap[child_index].m_priority)
					break;
				m_heap[heap_index] = m_heap[child_index];
				heap_index = child_index;
			}

			m_heap[heap_index].m_index = orig_index;
			m_heap[heap_index].m_priority = orig_priority;
		}